

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode Curl_is_connected(connectdata *conn,int sockindex,_Bool *connected)

{
  undefined1 *puVar1;
  Curl_easy *pCVar2;
  long lVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  int iVar10;
  _Bool *connected_00;
  CURLcode CVar11;
  _Bool _Var12;
  CURLcode CVar13;
  uint uVar14;
  CURLcode CVar15;
  Curl_addrinfo *ai;
  timediff_t tVar16;
  int *piVar17;
  char *pcVar18;
  Curl_addrinfo *pCVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  bool bVar24;
  curltime cVar25;
  curltime newer;
  curltime older;
  curltime older_00;
  int error;
  char ipaddress [46];
  char buffer [256];
  int local_1ac;
  CURLcode local_1a8;
  int local_1a4;
  Curl_easy *local_1a0;
  uint local_194;
  curltime local_190;
  long local_180;
  _Bool *local_178;
  ulong local_170;
  char local_168 [48];
  char local_138 [264];
  
  pCVar2 = conn->data;
  local_1ac = 0;
  *connected = false;
  if ((conn->bits).tcpconnect[sockindex] == true) {
    *connected = true;
  }
  else {
    cVar25 = Curl_now();
    local_190.tv_sec = cVar25.tv_sec;
    local_190.tv_usec = cVar25.tv_usec;
    local_170 = Curl_timeleft(pCVar2,&local_190,true);
    if ((long)local_170 < 0) {
      Curl_failf(pCVar2,"Connection time-out");
      return CURLE_OPERATION_TIMEDOUT;
    }
    if ((conn->cnnct).state - CONNECT_SOCKS_INIT < 0x10) {
      CVar13 = connect_SOCKS(conn,sockindex,connected);
      if (CVar13 != CURLE_OK) {
        return CVar13;
      }
      if (*connected != true) {
        return CURLE_OK;
      }
      post_SOCKS(conn,sockindex,connected);
      return CURLE_OK;
    }
    CVar13 = CURLE_OK;
    lVar20 = 0;
    local_1a4 = sockindex;
    local_1a0 = pCVar2;
    local_180 = (long)sockindex;
    local_178 = connected;
    do {
      if (conn->tempsock[lVar20] == -1) {
        iVar22 = 6;
        CVar11 = local_1a8;
      }
      else {
        uVar21 = (uint)lVar20 ^ 1;
        local_1ac = 0;
        uVar14 = Curl_socket_check(-1,-1,conn->tempsock[lVar20],0);
        if (uVar14 == 2) {
LAB_0010e0b3:
          _Var12 = verifyconnect(conn->tempsock[lVar20],&local_1ac);
          if (_Var12) {
            conn->sock[local_180] = conn->tempsock[lVar20];
            pCVar19 = conn->tempaddr[lVar20];
            conn->ip_addr = pCVar19;
            conn->tempsock[lVar20] = -1;
            *(ulong *)&(conn->bits).field_0x4 =
                 *(ulong *)&(conn->bits).field_0x4 & 0xffffffffffffdfff |
                 (ulong)(pCVar19->ai_family == 10) << 0xd;
            if (conn->tempsock[uVar21] != -1) {
              Curl_closesocket(conn,conn->tempsock[uVar21]);
              conn->tempsock[uVar21] = -1;
            }
            connected_00 = local_178;
            CVar13 = connect_SOCKS(conn,sockindex,local_178);
            iVar22 = 1;
            CVar11 = CVar13;
            if ((CVar13 == CURLE_OK) && (*connected_00 == true)) {
              post_SOCKS(conn,sockindex,connected_00);
              CVar13 = CURLE_OK;
              local_1a8 = CURLE_OK;
              CVar11 = local_1a8;
            }
            goto LAB_0010e29f;
          }
        }
        else if (uVar14 == 0) {
          cVar25.tv_usec = local_190.tv_usec;
          cVar25.tv_sec = local_190.tv_sec;
          uVar6 = (conn->connecttime).tv_sec;
          uVar7 = (conn->connecttime).tv_usec;
          older.tv_usec = uVar7;
          older.tv_sec = uVar6;
          cVar25._12_4_ = 0;
          older._12_4_ = 0;
          tVar16 = Curl_timediff(cVar25,older);
          if (conn->timeoutms_per_addr[lVar20] <= tVar16) {
            Curl_infof(local_1a0,"After %ldms connect time, move on!\n");
            local_1ac = 0x6e;
          }
          if (((lVar20 == 0) && ((*(ulong *)&(conn->bits).field_0x4 & 0x400000000) == 0)) &&
             (newer.tv_usec = local_190.tv_usec, newer.tv_sec = local_190.tv_sec,
             uVar8 = (conn->connecttime).tv_sec, uVar9 = (conn->connecttime).tv_usec,
             older_00.tv_usec = uVar9, older_00.tv_sec = uVar8, newer._12_4_ = 0,
             older_00._12_4_ = 0, tVar16 = Curl_timediff(newer,older_00),
             (local_1a0->set).happy_eyeballs_timeout <= tVar16)) {
            puVar1 = &(conn->bits).field_0x4;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x400000000;
            trynextip(conn,sockindex,1);
          }
        }
        else {
          if (((conn->bits).field_0x7 & 4) != 0) goto LAB_0010e0b3;
          if ((uVar14 & 4) != 0) {
            verifyconnect(conn->tempsock[lVar20],&local_1ac);
          }
        }
        pCVar2 = local_1a0;
        iVar10 = local_1ac;
        iVar23 = 0;
        iVar22 = iVar23;
        CVar11 = local_1a8;
        local_194 = uVar21;
        if (local_1ac != 0) {
          (local_1a0->state).os_errno = local_1ac;
          piVar17 = __errno_location();
          *piVar17 = iVar10;
          sockindex = local_1a4;
          CVar11 = local_1a8;
          if (conn->tempaddr[lVar20] != (Curl_addrinfo *)0x0) {
            Curl_printable_address(conn->tempaddr[lVar20],local_168,0x2e);
            lVar3 = conn->port;
            pcVar18 = Curl_strerror(local_1ac,local_138,0x100);
            Curl_infof(pCVar2,"connect to %s port %ld failed: %s\n",local_168,lVar3,pcVar18);
            sockindex = local_1a4;
            pCVar19 = conn->tempaddr[lVar20];
            conn->timeoutms_per_addr[lVar20] =
                 local_170 >> (pCVar19->ai_next != (Curl_addrinfo *)0x0);
            if (pCVar19 != (Curl_addrinfo *)0x0) {
              pCVar19 = pCVar19->ai_next;
            }
            if (pCVar19 != (Curl_addrinfo *)0x0) {
              do {
                if (pCVar19->ai_family == conn->tempfamily[lVar20]) break;
                pCVar19 = pCVar19->ai_next;
              } while (pCVar19 != (Curl_addrinfo *)0x0);
            }
            conn->tempaddr[lVar20] = pCVar19;
            CVar15 = trynextip(conn,local_1a4,(uint)lVar20);
            CVar11 = local_1a8;
            if ((CVar15 != CURLE_COULDNT_CONNECT) || (iVar22 = 0, conn->tempsock[local_194] == -1))
            {
              CVar13 = CVar15;
              iVar22 = iVar23;
            }
          }
        }
      }
LAB_0010e29f:
      local_1a8 = CVar11;
      if ((iVar22 != 6) && (iVar22 != 0)) {
        return local_1a8;
      }
      bVar24 = lVar20 == 0;
      lVar20 = lVar20 + 1;
    } while (bVar24);
    if (CVar13 == CURLE_OK) {
      return CURLE_OK;
    }
    if (conn->tempsock[0] != -1) {
      return CURLE_OK;
    }
    if (conn->tempsock[1] != -1) {
      return CURLE_OK;
    }
    CVar13 = trynextip(conn,sockindex,1);
    if (CVar13 != CURLE_OK) {
      uVar4 = *(ulong *)&(conn->bits).field_0x4;
      lVar20 = 0x390;
      if ((((uVar4 & 2) == 0) && (lVar20 = 0x3d0, (uVar4 & 1) == 0)) &&
         (lVar20 = 0x370, ((uint)uVar4 >> 8 & 1) == 0)) {
        lVar20 = 0x340;
      }
      uVar5 = *(undefined8 *)((conn->cnnct).socksreq + lVar20 + -0xc);
      lVar20 = conn->port;
      pcVar18 = Curl_strerror(local_1ac,local_138,0x100);
      pCVar2 = local_1a0;
      Curl_failf(local_1a0,"Failed to connect to %s port %ld: %s",uVar5,lVar20,pcVar18);
      if ((pCVar2->state).os_errno != 0x6e) {
        return CVar13;
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_is_connected(struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;
  timediff_t allow;
  int error = 0;
  struct curltime now;
  int rc = 0;
  unsigned int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_now();

  /* figure out how long time we have left to connect */
  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(SOCKS_STATE(conn->cnnct.state)) {
    /* still doing SOCKS */
    result = connect_SOCKS(conn, sockindex, connected);
    if(!result && *connected)
      post_SOCKS(conn, sockindex, connected);
    return result;
  }

  for(i = 0; i<2; i++) {
    const int other = i ^ 1;
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;
    error = 0;
#ifdef ENABLE_QUIC
    if(conn->transport == TRNSPRT_QUIC) {
      result = Curl_quic_is_connected(conn, i, connected);
      if(!result && *connected) {
        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
        post_SOCKS(conn, sockindex, connected);
        connkeep(conn, "HTTP/3 default");
        return CURLE_OK;
      }
      if(result)
        error = SOCKERRNO;
    }
    else
#endif
    {
#ifdef mpeix
      /* Call this function once now, and ignore the results. We do this to
         "clear" the error state on the socket so that we can later read it
         reliably. This is reported necessary on the MPE/iX operating
         system. */
      (void)verifyconnect(conn->tempsock[i], NULL);
#endif

      /* check socket for connect */
      rc = SOCKET_WRITABLE(conn->tempsock[i], 0);
    }

    if(rc == 0) { /* no connection yet */
      if(Curl_timediff(now, conn->connecttime) >=
         conn->timeoutms_per_addr[i]) {
        infof(data, "After %" CURL_FORMAT_TIMEDIFF_T
              "ms connect time, move on!\n", conn->timeoutms_per_addr[i]);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && !conn->bits.parallel_connect &&
         (Curl_timediff(now, conn->connecttime) >=
          data->set.happy_eyeballs_timeout)) {
        conn->bits.parallel_connect = TRUE; /* starting now */
        trynextip(conn, sockindex, 1);
      }
    }
    else if(rc == CURL_CSELECT_OUT || conn->bits.tcp_fastopen) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
#ifdef ENABLE_IPV6
        conn->bits.ipv6 = (conn->ip_addr->ai_family == AF_INET6)?TRUE:FALSE;
#endif

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to kick off any SOCKS proxy magic once we
           connected */
        result = connect_SOCKS(conn, sockindex, connected);
        if(result || !*connected)
          return result;

        post_SOCKS(conn, sockindex, connected);

        return CURLE_OK;
      }
    }
    else if(rc & CURL_CSELECT_ERR) {
      (void)verifyconnect(conn->tempsock[i], &error);
    }

    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        CURLcode status;
#ifndef CURL_DISABLE_VERBOSE_STRINGS
        char ipaddress[MAX_IPADR_LEN];
        char buffer[STRERROR_LEN];
        Curl_printable_address(conn->tempaddr[i], ipaddress,
                               sizeof(ipaddress));
        infof(data, "connect to %s port %ld failed: %s\n",
              ipaddress, conn->port,
              Curl_strerror(error, buffer, sizeof(buffer)));
#endif

        conn->timeoutms_per_addr[i] = conn->tempaddr[i]->ai_next == NULL ?
          allow : allow / 2;
        ainext(conn, i, TRUE);
        status = trynextip(conn, sockindex, i);
        if((status != CURLE_COULDNT_CONNECT) ||
           conn->tempsock[other] == CURL_SOCKET_BAD)
          /* the last attempt failed and no other sockets remain open */
          result = status;
      }
    }
  }

  if(result &&
     (conn->tempsock[0] == CURL_SOCKET_BAD) &&
     (conn->tempsock[1] == CURL_SOCKET_BAD)) {
    /* no more addresses to try */
    const char *hostname;
    char buffer[STRERROR_LEN];

    /* if the first address family runs out of addresses to try before the
       happy eyeball timeout, go ahead and try the next family now */
    result = trynextip(conn, sockindex, 1);
    if(!result)
      return result;

#ifndef CURL_DISABLE_PROXY
    if(conn->bits.socksproxy)
      hostname = conn->socks_proxy.host.name;
    else if(conn->bits.httpproxy)
      hostname = conn->http_proxy.host.name;
    else
#endif
      if(conn->bits.conn_to_host)
        hostname = conn->conn_to_host.name;
    else
      hostname = conn->host.name;

    failf(data, "Failed to connect to %s port %ld: %s",
          hostname, conn->port,
          Curl_strerror(error, buffer, sizeof(buffer)));

    Curl_quic_disconnect(conn, 0);
    Curl_quic_disconnect(conn, 1);

#ifdef WSAETIMEDOUT
    if(WSAETIMEDOUT == data->state.os_errno)
      result = CURLE_OPERATION_TIMEDOUT;
#elif defined(ETIMEDOUT)
    if(ETIMEDOUT == data->state.os_errno)
      result = CURLE_OPERATION_TIMEDOUT;
#endif
  }
  else
    result = CURLE_OK; /* still trying */

  return result;
}